

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_Port_Reg8_Data8(VGMPlayer *this)

{
  UINT8 *pUVar1;
  CHIP_DEVICE *cDev;
  ulong uVar2;
  
  cDev = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                      this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((cDev != (CHIP_DEVICE *)0x0) && (cDev->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    pUVar1 = this->_fileData;
    uVar2 = (ulong)this->_filePos;
    SendYMCommand(cDev,pUVar1[uVar2 + 1] & 0x7f,pUVar1[uVar2 + 2],pUVar1[uVar2 + 3]);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Port_Reg8_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	SendYMCommand(cDev, fData[0x01] & 0x7F, fData[0x02], fData[0x03]);
	return;
}